

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = false;
  if (0x1f < (uint)c->header) {
    uVar2 = (ulong)((uint)c->header >> 5);
    bVar5 = true;
    uVar4 = 1;
    do {
      iVar3 = (int)c[uVar4].header >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar3) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[iVar3].value;
      if ((SUB41(c[uVar4].header,0) & 1 ^ bVar1) == l_True && (l_True & 2) == 0 ||
          (bVar1 & l_True & 2) != 0) {
        return bVar5;
      }
      bVar5 = uVar4 < uVar2;
      bVar6 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; }